

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTRuntimeInfoTracker.h
# Opt level: O3

void __thiscall
TTD::ThreadContextTTD::AddRootRef_Record
          (ThreadContextTTD *this,TTD_LOG_PTR_ID origId,RecyclableObject *newRoot)

{
  WeaklyReferencedKeyDictionary<Js::RecyclableObject,_bool,_RecyclerPointerComparer<const_Js::RecyclableObject_*>,_true>
  *this_00;
  TTD_LOG_PTR_ID local_40;
  TTD_LOG_PTR_ID origId_local;
  RecyclableObject *newRoot_local;
  
  local_40 = origId;
  origId_local = (TTD_LOG_PTR_ID)newRoot;
  this_00 = Memory::
            RecyclerRootPtr<JsUtil::WeaklyReferencedKeyDictionary<Js::RecyclableObject,_bool,_RecyclerPointerComparer<const_Js::RecyclableObject_*>,_true>_>
            ::operator->(&this->m_ttdRecordRootWeakMap);
  JsUtil::
  WeaklyReferencedKeyDictionary<Js::RecyclableObject,_bool,_RecyclerPointerComparer<const_Js::RecyclableObject_*>,_true>
  ::Insert(this_00,newRoot,true,false,true);
  newRoot_local._7_1_ = 1;
  JsUtil::
  BaseDictionary<unsigned_long,bool,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
  ::
  Insert<(JsUtil::BaseDictionary<unsigned_long,bool,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)2>
            ((BaseDictionary<unsigned_long,bool,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
              *)&this->m_ttdMayBeLongLivedRoot,&local_40,(bool *)((long)&newRoot_local + 7));
  JsUtil::
  BaseDictionary<unsigned_long,Js::RecyclableObject*,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
  ::
  Insert<(JsUtil::BaseDictionary<unsigned_long,Js::RecyclableObject*,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)2>
            ((BaseDictionary<unsigned_long,Js::RecyclableObject*,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
              *)&this->m_ttdRootTagToObjectMap,&local_40,(RecyclableObject **)&origId_local);
  return;
}

Assistant:

void AddRootRef_Record(TTD_LOG_PTR_ID origId, Js::RecyclableObject* newRoot)
        {
            this->m_ttdRecordRootWeakMap->Item(newRoot, true);

            this->m_ttdMayBeLongLivedRoot.Item(origId, true);
            this->m_ttdRootTagToObjectMap.Item(origId, newRoot);
        }